

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

size_t FNV2(char *key,int len,size_t seed)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  size_t h;
  ulong *puVar4;
  size_t sVar5;
  size_t *dw;
  char *pcVar6;
  long lVar7;
  
  uVar3 = (ulong)len;
  sVar5 = seed ^ 0xcbf29ce484222325;
  puVar4 = (ulong *)key;
  pcVar6 = key;
  if (0 < (long)(uVar3 & 0xfffffffffffffff8)) {
    do {
      uVar2 = *puVar4;
      puVar4 = puVar4 + 1;
      pcVar6 = pcVar6 + 8;
      sVar5 = (sVar5 ^ uVar2) * 0x100000001b3;
    } while (puVar4 < key + (uVar3 & 0xfffffffffffffff8));
  }
  if (key + uVar3 <= puVar4 || (uVar3 & 7) == 0) {
    return sVar5;
  }
  lVar7 = 0;
  do {
    pbVar1 = (byte *)((long)puVar4 + lVar7);
    lVar7 = lVar7 + 1;
    sVar5 = (*pbVar1 ^ sVar5) * 0x100000001b3;
  } while ((long)(key + uVar3) - (long)pcVar6 != lVar7);
  return sVar5;
}

Assistant:

size_t
FNV2(const char *key, int len, size_t seed)
{
  size_t h = seed;
  size_t *dw = (size_t *)key; //word stepper
  const size_t *const endw = &((const size_t*)key)[len/sizeof(size_t)];
#ifdef HAVE_BIT32
  h ^= UINT32_C(2166136261);
#else
  h ^= UINT64_C(0xcbf29ce484222325);
#endif
  while (dw < endw) {
    h ^= *dw++;
#ifdef HAVE_BIT32
    h *= UINT32_C(16777619);
#else
    h *= UINT64_C(0x100000001b3);
#endif
  }
  if (len & (sizeof(size_t)-1)) {
    uint8_t *dc = (uint8_t*)dw; //byte stepper
    const uint8_t *const endc = &((const uint8_t*)key)[len];
    while (dc < endc) {
      h ^= *dc++;
#ifdef HAVE_BIT32
      h *= UINT32_C(16777619);
#else
      h *= UINT64_C(0x100000001b3);
#endif
    }
  }
  return h;
}